

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

void __thiscall Spi::send_byte(Spi *this,uint8_t data)

{
  ostream *poVar1;
  uint local_20;
  uint8_t local_19;
  DWORD dwNumBytesSent;
  BYTE byOutputBuffer [1];
  FT_STATUS ftStatus;
  uint8_t data_local;
  Spi *this_local;
  
  local_20 = 0;
  local_19 = data;
  byOutputBuffer[0] = data;
  dwNumBytesSent = FT_Write(this->ftHandle,&local_19,1,&local_20);
  if (dwNumBytesSent != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Write error!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    error(this,2);
  }
  if (local_20 != 1) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Write error (single byte, received ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    poVar1 = std::operator<<(poVar1,", expected 1).");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    error(this,2);
  }
  return;
}

Assistant:

void Spi::send_byte(uint8_t data) {
	FT_STATUS ftStatus;
	BYTE byOutputBuffer[1];
	DWORD dwNumBytesSent = 0;

	byOutputBuffer[0] = data;

	ftStatus = FT_Write(ftHandle, byOutputBuffer, 1, &dwNumBytesSent);
	if (ftStatus != FT_OK) {
		cerr << "Write error!" << endl;
		error(2);
	}
	if (dwNumBytesSent != 1) {
		cerr << "Write error (single byte, received " << dwNumBytesSent
				<< ", expected 1)." << endl;
		error(2);
	}
}